

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsnnode.h
# Opt level: O3

int __thiscall WSNNode::layer(WSNNode *this)

{
  int iVar1;
  float fVar2;
  
  fVar2 = SQRT((float)(this->y * this->y + this->x * this->x));
  iVar1 = 0;
  if (((303.0 <= fVar2) && (iVar1 = 1, 428.0 <= fVar2)) && (iVar1 = 2, 524.0 <= fVar2)) {
    iVar1 = (608.0 <= fVar2) + 3;
  }
  return iVar1;
}

Assistant:

float distance()const{return sqrt(float(x*x+y*y));}